

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

uint __thiscall
crnlib::ktx_texture::add_key_value(ktx_texture *this,char *pKey,void *pVal,uint val_size)

{
  ktx_key_value_vec *this_00;
  uint uVar1;
  uint uVar2;
  void *p;
  size_t sVar3;
  long lVar4;
  vector<unsigned_char> *pvVar5;
  uint min_new_capacity;
  
  this_00 = &this->m_key_values;
  uVar1 = (this->m_key_values).m_size;
  min_new_capacity = uVar1 + 1;
  if (min_new_capacity == 0) {
    pvVar5 = this_00->m_p;
    lVar4 = 0;
    do {
      p = *(void **)((long)&pvVar5->m_p + lVar4);
      if (p != (void *)0x0) {
        crnlib_free(p);
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0xffffffff0);
  }
  else {
    if ((this->m_key_values).m_capacity < min_new_capacity) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,min_new_capacity,true,0x10,(object_mover)0x0,false);
    }
    uVar2 = (this->m_key_values).m_size;
    if (min_new_capacity != uVar2) {
      memset(this_00->m_p + uVar2,0,(ulong)(min_new_capacity - uVar2) << 4);
    }
  }
  (this->m_key_values).m_size = min_new_capacity;
  pvVar5 = (this->m_key_values).m_p + uVar1;
  sVar3 = strlen(pKey);
  vector<unsigned_char>::append(pvVar5,(uchar *)pKey,(int)sVar3 + 1);
  vector<unsigned_char>::append(pvVar5,(uchar *)pVal,val_size);
  return uVar1;
}

Assistant:

uint ktx_texture::add_key_value(const char* pKey, const void* pVal, uint val_size)
    {
        const uint idx = m_key_values.size();
        m_key_values.resize(idx + 1);
        uint8_vec& v = m_key_values.back();
        v.append(reinterpret_cast<const uint8*>(pKey), static_cast<uint>(strlen(pKey)) + 1);
        v.append(static_cast<const uint8*>(pVal), val_size);
        return idx;
    }